

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O1

vector<serial_port,_std::allocator<serial_port>_> *
open_ports(vector<serial_port,_std::allocator<serial_port>_> *__return_storage_ptr__,
          vector<interface,_std::allocator<interface>_> *interfaces,io_context *queue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  baud_rate bVar2;
  parity pVar3;
  stop_bits sVar4;
  character_size cVar5;
  string *psVar6;
  runtime_error *this;
  long *plVar7;
  size_type *psVar8;
  pointer c;
  error_code ec;
  string local_188;
  vector<serial_port,_std::allocator<serial_port>_> *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  pointer local_140;
  io_context *local_138;
  error_code local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  serial_port local_e0;
  
  (__return_storage_ptr__->super__Vector_base<serial_port,_std::allocator<serial_port>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<serial_port,_std::allocator<serial_port>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<serial_port,_std::allocator<serial_port>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c = (interfaces->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
      super__Vector_impl_data._M_start;
  local_140 = (interfaces->super__Vector_base<interface,_std::allocator<interface>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_168 = __return_storage_ptr__;
  if (c != local_140) {
    paVar1 = &local_188.field_2;
    local_138 = queue;
    do {
      serial_port::serial_port(&local_e0,c,local_138);
      boost::system::error_code::error_code(&local_130);
      psVar6 = interface::device_abi_cxx11_(c);
      boost::asio::detail::reactive_serial_port_service::open
                (local_e0.port.impl_.service_,(char *)&local_e0.port.impl_.implementation_,
                 (int)psVar6,&local_130);
      if (local_130.failed_ == true) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        psVar6 = interface::device_abi_cxx11_(c);
        std::operator+(&local_100,"error opening interface \"",psVar6);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_160._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_160._M_dataplus._M_p == psVar8) {
          local_160.field_2._M_allocated_capacity = *psVar8;
          local_160.field_2._8_4_ = (undefined4)plVar7[3];
          local_160.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar8;
        }
        local_160._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        (*(local_130.cat_)->_vptr_error_category[4])
                  (&local_120,local_130.cat_,(ulong)(uint)local_130.val_);
        std::operator+(&local_188,&local_160,&local_120);
        std::runtime_error::runtime_error(this,(string *)&local_188);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar2 = interface::baud_rate(c);
      local_160._M_dataplus._M_p._0_4_ = bVar2.value_;
      psVar6 = interface::device_abi_cxx11_(c);
      local_188.field_2._M_allocated_capacity._0_4_ = 0x64756162;
      local_188.field_2._M_allocated_capacity._4_2_ = 0x725f;
      local_188.field_2._M_local_buf[6] = 'a';
      local_188.field_2._M_local_buf[7] = 't';
      local_188.field_2._M_local_buf[8] = 'e';
      local_188._M_string_length = 9;
      local_188.field_2._M_local_buf[9] = '\0';
      local_188._M_dataplus._M_p = (pointer)paVar1;
      set_port_option<boost::asio::serial_port_base::baud_rate>
                (&local_e0,(baud_rate *)&local_160,psVar6,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      pVar3 = interface::parity(c);
      local_160._M_dataplus._M_p._0_4_ = pVar3.value_;
      psVar6 = interface::device_abi_cxx11_(c);
      local_188.field_2._M_allocated_capacity._4_2_ = 0x7974;
      local_188.field_2._M_allocated_capacity._0_4_ = 0x69726170;
      local_188._M_string_length = 6;
      local_188.field_2._M_local_buf[6] = '\0';
      local_188._M_dataplus._M_p = (pointer)paVar1;
      set_port_option<boost::asio::serial_port_base::parity>
                (&local_e0,(parity *)&local_160,psVar6,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      sVar4 = interface::stop_bits(c);
      local_160._M_dataplus._M_p._0_4_ = sVar4.value_;
      psVar6 = interface::device_abi_cxx11_(c);
      local_188.field_2._M_allocated_capacity._0_4_ = 0x706f7473;
      local_188.field_2._M_allocated_capacity._4_2_ = 0x625f;
      local_188.field_2._M_local_buf[6] = 'i';
      local_188.field_2._M_local_buf[7] = 't';
      local_188.field_2._M_local_buf[8] = 's';
      local_188._M_string_length = 9;
      local_188.field_2._M_local_buf[9] = '\0';
      local_188._M_dataplus._M_p = (pointer)paVar1;
      set_port_option<boost::asio::serial_port_base::stop_bits>
                (&local_e0,(stop_bits *)&local_160,psVar6,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      cVar5 = interface::character_size(c);
      local_160._M_dataplus._M_p._0_4_ = cVar5.value_;
      psVar6 = interface::device_abi_cxx11_(c);
      local_188.field_2._M_local_buf[8] = 'r';
      local_188.field_2._M_local_buf[9] = '_';
      local_188.field_2._10_4_ = 0x657a6973;
      local_188.field_2._M_allocated_capacity._0_4_ = 0x72616863;
      local_188.field_2._M_allocated_capacity._4_2_ = 0x6361;
      local_188.field_2._M_local_buf[6] = 't';
      local_188.field_2._M_local_buf[7] = 'e';
      local_188._M_string_length = 0xe;
      local_188.field_2._M_local_buf[0xe] = '\0';
      local_188._M_dataplus._M_p = (pointer)paVar1;
      set_port_option<boost::asio::serial_port_base::character_size>
                (&local_e0,(character_size *)&local_160,psVar6,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      std::vector<serial_port,_std::allocator<serial_port>_>::emplace_back<serial_port>
                (local_168,&local_e0);
      if (local_e0.read_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.read_buffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      boost::asio::detail::
      io_object_impl<boost::asio::detail::reactive_serial_port_service,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::~io_object_impl(&local_e0.port.impl_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.configuration.alias_._M_dataplus._M_p !=
          &local_e0.configuration.alias_.field_2) {
        operator_delete(local_e0.configuration.alias_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.configuration.device_._M_dataplus._M_p !=
          &local_e0.configuration.device_.field_2) {
        operator_delete(local_e0.configuration.device_._M_dataplus._M_p);
      }
      c = c + 1;
    } while (c != local_140);
  }
  return local_168;
}

Assistant:

std::vector< serial_port > open_ports(
    const std::vector< interface >& interfaces, boost::asio::io_context& queue )
{
    std::vector< serial_port > ports;

    std::transform( interfaces.begin(), interfaces.end(), back_inserter( ports ),
        [&queue]( const interface& config )
        {
            serial_port port( config, queue );

            boost::system::error_code ec;
            port.port.open( config.device(), ec );

            if ( ec )
                throw std::runtime_error( "error opening interface \"" + config.device() + "\": " + ec.message() );

            set_port_option( port, config.baud_rate(), config.device(), "baud_rate" );
            set_port_option( port, config.parity(), config.device(), "parity" );
            set_port_option( port, config.stop_bits(), config.device(), "stop_bits" );
            set_port_option( port, config.character_size(), config.device(), "character_size" );

            return port;
        }
    );

    return ports;
}